

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O1

void __thiscall PerseusBGPlanner::BackupStage(PerseusBGPlanner *this)

{
  QFunctionsDiscrete *in_RCX;
  BeliefSet *in_RDX;
  long in_RSI;
  
  BackupStage((QFunctionsDiscrete *)this,(PerseusBGPlanner *)(in_RSI + -0x18),in_RDX,in_RCX);
  return;
}

Assistant:

QFunctionsDiscrete
PerseusBGPlanner::BackupStage(const BeliefSet &S,
                              const QFunctionsDiscrete &Q) const
{
    if(_m_computeVectorForEachBelief)
        return(BackupStageAll(S,Q));
    else
    {
#if PerseusBGPlanner_alternativeSampling
        return(BackupStageSamplingAlt(S,Q));
#else
        return(BackupStageSampling(S,Q));
#endif        
    }
}